

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall soul::heart::Statement::Statement(Statement *this,CodeLocation *l)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_002fa708;
  pSVar1 = (l->sourceCode).object;
  pcVar2 = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  (this->super_Object).location.sourceCode.object = pSVar1;
  (this->super_Object).location.location.data = pcVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_002fb2d8;
  this->nextObject = (Statement *)0x0;
  return;
}

Assistant:

Statement (CodeLocation l) : Object (std::move (l)) {}